

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void trb_print_subtree_nodes
               (trt_node *node,uint32_t max_gap_before_type,trt_wrapper wr,trt_parent_cache ca,
               trt_printer_ctx *pc,trt_tree_ctx *tc)

{
  trt_wrapper wr_00;
  trt_wrapper wr_01;
  trt_wrapper tVar1;
  trt_parent_cache ca_00;
  trt_parent_cache ca_01;
  trt_parent_cache ca_02;
  trt_parent_cache ca_03;
  trt_parent_cache ca_04;
  trt_node *ptVar2;
  ly_bool lVar3;
  undefined8 in_stack_fffffffffffffe10;
  undefined1 local_1c8 [96];
  trt_wrapper local_168;
  undefined1 local_150 [8];
  trt_wrapper wr_case_child;
  undefined1 local_d8 [96];
  trt_parent_cache local_78;
  trt_wrapper local_68;
  trt_wrapper local_50;
  trt_tree_ctx *local_38;
  trt_tree_ctx *tc_local;
  trt_printer_ctx *pc_local;
  trt_node *ptStack_20;
  uint32_t max_gap_before_type_local;
  trt_node *node_local;
  trt_parent_cache ca_local;
  
  tVar1 = wr;
  ca_local._0_8_ = ca.last_list;
  node_local = ca._0_8_;
  local_38 = tc;
  tc_local = (trt_tree_ctx *)pc;
  pc_local._4_4_ = max_gap_before_type;
  ptStack_20 = node;
  lVar3 = trp_node_is_empty(node);
  ptVar2 = ptStack_20;
  if (lVar3 == '\0') {
    trb_print_entire_node(ptStack_20,pc_local._4_4_,wr,(trt_printer_ctx *)tc_local,local_38);
    lVar3 = trp_ext_is_present_in_node(local_38);
    if (lVar3 != '\0') {
      ca_00.last_list = (lysp_node_list *)ca_local._0_8_;
      ca_00._0_8_ = node_local;
      trb_ext_print_instances(wr,ca_00,(trt_printer_ctx *)tc_local,local_38);
    }
    lVar3 = trb_node_is_last_sibling((trt_fp_all *)&tc_local->pmod,local_38);
    wr = tVar1;
    if (lVar3 == '\0') {
      tVar1._16_8_ = in_stack_fffffffffffffe10;
      tVar1._0_16_ = wr._8_16_;
      trp_wrapper_set_mark(tVar1);
      wr.type = local_68.type;
      wr._4_4_ = local_68._4_4_;
    }
    else {
      wr_01._16_8_ = in_stack_fffffffffffffe10;
      wr_01._0_16_ = wr._8_16_;
      trp_wrapper_set_shift(wr_01);
      wr.type = local_50.type;
      wr._4_4_ = local_50._4_4_;
    }
    ca_01.last_list = (lysp_node_list *)ca_local._0_8_;
    ca_01._0_8_ = node_local;
    local_78 = tro_parent_cache_for_child(ca_01,local_38);
    ptVar2 = ptStack_20;
    node_local = (trt_node *)local_78._0_8_;
    ca_local._0_8_ = local_78.last_list;
    (*(code *)tc_local->tpn)(local_d8,local_78._0_8_,local_78.last_list,local_38);
    memcpy(ptVar2,local_d8,0x60);
    lVar3 = trp_node_is_empty(ptStack_20);
    if (lVar3 != '\0') {
      return;
    }
    ca_02.last_list = (lysp_node_list *)ca_local._0_8_;
    ca_02._0_8_ = node_local;
    pc_local._4_4_ = trb_try_unified_indent(ca_02,(trt_printer_ctx *)tc_local,local_38);
  }
  else {
    (*(code *)tc_local->cmod)(&wr_case_child.actual_pos,node_local,ca_local._0_8_,local_38);
    memcpy(ptVar2,&wr_case_child.actual_pos,0x60);
  }
  do {
    if (((local_38->plugin_ctx).filtered == '\0') &&
       (lVar3 = trb_need_implicit_node_case(local_38), lVar3 == '\0')) {
      ly_print_(*(ly_out **)tc_local,"\n");
      ca_03.last_list = (lysp_node_list *)ca_local._0_8_;
      ca_03._0_8_ = node_local;
      trb_print_subtree_nodes
                (ptStack_20,pc_local._4_4_,wr,ca_03,(trt_printer_ctx *)tc_local,local_38);
    }
    else if ((local_38->plugin_ctx).filtered == '\0') {
      trb_print_implicit_node(&local_168,ptStack_20,wr,(trt_printer_ctx *)tc_local,local_38);
      local_150 = (undefined1  [8])local_168._0_8_;
      wr_case_child._0_8_ = local_168.bit_marks1;
      wr_case_child.bit_marks1 = local_168._16_8_;
      ca_04.last_list = (lysp_node_list *)ca_local._0_8_;
      ca_04._0_8_ = node_local;
      wr_00.bit_marks1 = local_168.bit_marks1;
      wr_00.type = local_168.type;
      wr_00._4_4_ = local_168._4_4_;
      wr_00.actual_pos = local_168.actual_pos;
      wr_00._20_4_ = local_168._20_4_;
      trb_print_subtree_nodes
                (ptStack_20,pc_local._4_4_,wr_00,ca_04,(trt_printer_ctx *)tc_local,local_38);
    }
    ptVar2 = ptStack_20;
    (*(code *)tc_local->pn)(local_1c8,node_local,ca_local._0_8_,local_38);
    memcpy(ptVar2,local_1c8,0x60);
    lVar3 = trp_node_is_empty(ptStack_20);
  } while (lVar3 == '\0');
  (*(code *)tc_local->pmod)(local_38);
  return;
}

Assistant:

static void
trb_print_subtree_nodes(struct trt_node *node, uint32_t max_gap_before_type, struct trt_wrapper wr,
        struct trt_parent_cache ca, struct trt_printer_ctx *pc, struct trt_tree_ctx *tc)
{
    if (!trp_node_is_empty(node)) {
        /* Print root node. */
        trb_print_entire_node(node, max_gap_before_type, wr, pc, tc);
        if (trp_ext_is_present_in_node(tc)) {
            trb_ext_print_instances(wr, ca, pc, tc);
        }
        /* if node is last sibling, then do not add '|' to wrapper */
        wr = trb_node_is_last_sibling(&pc->fp, tc) ?
                trp_wrapper_set_shift(wr) : trp_wrapper_set_mark(wr);
        /* go to the child */
        ca = tro_parent_cache_for_child(ca, tc);
        *node = pc->fp.modify.next_child(ca, tc);
        if (trp_node_is_empty(node)) {
            return;
        }
        /* TODO comment browse through instances + filtered. try unified indentation for children */
        max_gap_before_type = trb_try_unified_indent(ca, pc, tc);
    } else {
        /* Root node is ignored, continue with child. */
        *node = pc->fp.modify.first_sibling(ca, tc);
    }

    do {
        if (!tc->plugin_ctx.filtered && !trb_need_implicit_node_case(tc)) {
            /* normal behavior */
            ly_print_(pc->out, "\n");
            trb_print_subtree_nodes(node, max_gap_before_type, wr, ca, pc, tc);
        } else if (!tc->plugin_ctx.filtered) {
            struct trt_wrapper wr_case_child;

            wr_case_child = trb_print_implicit_node(node, wr, pc, tc);
            trb_print_subtree_nodes(node, max_gap_before_type, wr_case_child, ca, pc, tc);
        }
        /* go to the actual node's sibling */
        *node = pc->fp.modify.next_sibling(ca, tc);
    } while (!trp_node_is_empty(node));

    /* get back from child node to root node */
    pc->fp.modify.parent(tc);
}